

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::plot
          (Persistence_landscape *this,char *filename,double xRangeBegin,double xRangeEnd,
          double yRangeBegin,double yRangeEnd,int from,int to)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  void *this_00;
  char *pcVar10;
  double dVar11;
  string local_470 [32];
  size_type local_450;
  size_t i;
  unsigned_long local_440;
  size_type local_438;
  unsigned_long local_430;
  unsigned_long local_428;
  size_t lambda_1;
  unsigned_long local_418;
  size_type local_410;
  unsigned_long local_408;
  size_type local_400;
  unsigned_long local_3f8;
  unsigned_long local_3f0;
  size_t lambda;
  ostringstream local_3b8 [8];
  ostringstream gnuplot_script;
  ostream local_240 [8];
  ofstream out;
  int local_40;
  int local_3c;
  int to_local;
  int from_local;
  double yRangeEnd_local;
  double yRangeBegin_local;
  double xRangeEnd_local;
  double xRangeBegin_local;
  char *filename_local;
  Persistence_landscape *this_local;
  
  std::ofstream::ofstream(local_240);
  std::__cxx11::ostringstream::ostringstream(local_3b8);
  poVar2 = std::operator<<((ostream *)local_3b8,filename);
  std::operator<<(poVar2,"_GnuplotScript");
  std::__cxx11::ostringstream::str();
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::open(local_240,uVar3,0x10);
  std::__cxx11::string::~string((string *)&lambda);
  dVar11 = std::numeric_limits<double>::max();
  if ((xRangeBegin == dVar11) && (!NAN(xRangeBegin) && !NAN(dVar11))) {
    dVar11 = std::numeric_limits<double>::max();
    if ((xRangeEnd == dVar11) && (!NAN(xRangeEnd) && !NAN(dVar11))) {
      dVar11 = std::numeric_limits<double>::max();
      if ((yRangeBegin == dVar11) && (!NAN(yRangeBegin) && !NAN(dVar11))) {
        dVar11 = std::numeric_limits<double>::max();
        if ((yRangeEnd == dVar11) && (!NAN(yRangeEnd) && !NAN(dVar11))) goto LAB_0010acb9;
      }
    }
  }
  poVar2 = std::operator<<(local_240,"set xrange [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,xRangeBegin);
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,xRangeEnd);
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_240,"set yrange [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,yRangeBegin);
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,yRangeEnd);
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
LAB_0010acb9:
  iVar1 = std::numeric_limits<int>::max();
  local_3c = from;
  if (from == iVar1) {
    local_3c = 0;
  }
  iVar1 = std::numeric_limits<int>::max();
  local_40 = to;
  if (to == iVar1) {
    sVar4 = std::
            vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ::size(&this->land);
    local_40 = (int)sVar4;
  }
  std::operator<<(local_240,"plot ");
  local_3f8 = (unsigned_long)local_3c;
  local_400 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::size(&this->land);
  puVar5 = std::min<unsigned_long>(&local_3f8,&local_400);
  local_3f0 = *puVar5;
  while( true ) {
    uVar6 = local_3f0;
    local_408 = (unsigned_long)local_40;
    local_410 = std::
                vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ::size(&this->land);
    puVar5 = std::min<unsigned_long>(&local_408,&local_410);
    if (uVar6 == *puVar5) break;
    std::operator<<(local_240,"     \'-\' using 1:2 notitle with lp");
    uVar6 = local_3f0 + 1;
    local_418 = (unsigned_long)local_40;
    lambda_1 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::size(&this->land);
    puVar5 = std::min<unsigned_long>(&local_418,&lambda_1);
    if (uVar6 != *puVar5) {
      std::operator<<(local_240,", \\");
    }
    std::ostream::operator<<(local_240,std::endl<char,std::char_traits<char>>);
    local_3f0 = local_3f0 + 1;
  }
  local_430 = (unsigned_long)local_3c;
  local_438 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::size(&this->land);
  puVar5 = std::min<unsigned_long>(&local_430,&local_438);
  local_428 = *puVar5;
  while( true ) {
    uVar6 = local_428;
    local_440 = (unsigned_long)local_40;
    i = std::
        vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
        ::size(&this->land);
    puVar5 = std::min<unsigned_long>(&local_440,&i);
    if (uVar6 == *puVar5) break;
    local_450 = 1;
    while( true ) {
      sVar4 = local_450;
      pvVar7 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,local_428);
      sVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar7);
      if (sVar4 == sVar8 - 1) break;
      pvVar7 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,local_428);
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar7,local_450);
      poVar2 = (ostream *)std::ostream::operator<<(local_240,pvVar9->first);
      poVar2 = std::operator<<(poVar2," ");
      pvVar7 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,local_428);
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar7,local_450);
      this_00 = (void *)std::ostream::operator<<(poVar2,pvVar9->second);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_450 = local_450 + 1;
    }
    poVar2 = std::operator<<(local_240,"EOF");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_428 = local_428 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
                          );
  std::__cxx11::ostringstream::str();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar10);
  poVar2 = std::operator<<(poVar2,"\'\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::ostringstream::~ostringstream(local_3b8);
  std::ofstream::~ofstream(local_240);
  return;
}

Assistant:

void Persistence_landscape::plot(const char* filename, double xRangeBegin, double xRangeEnd, double yRangeBegin,
                                 double yRangeEnd, int from, int to) {
  // this program create a gnuplot script file that allows to plot persistence diagram.
  std::ofstream out;

  std::ostringstream gnuplot_script;
  gnuplot_script << filename << "_GnuplotScript";
  out.open(gnuplot_script.str().c_str());

  if ((xRangeBegin != std::numeric_limits<double>::max()) || (xRangeEnd != std::numeric_limits<double>::max()) ||
      (yRangeBegin != std::numeric_limits<double>::max()) || (yRangeEnd != std::numeric_limits<double>::max())) {
    out << "set xrange [" << xRangeBegin << " : " << xRangeEnd << "]" << std::endl;
    out << "set yrange [" << yRangeBegin << " : " << yRangeEnd << "]" << std::endl;
  }

  if (from == std::numeric_limits<int>::max()) {
    from = 0;
  }
  if (to == std::numeric_limits<int>::max()) {
    to = this->land.size();
  }

  out << "plot ";
  for (size_t lambda = std::min((size_t)from, this->land.size()); lambda != std::min((size_t)to, this->land.size());
       ++lambda) {
    // out << "     '-' using 1:2 title 'l" << lambda << "' with lp";
    out << "     '-' using 1:2 notitle with lp";
    if (lambda + 1 != std::min((size_t)to, this->land.size())) {
      out << ", \\";
    }
    out << std::endl;
  }

  for (size_t lambda = std::min((size_t)from, this->land.size()); lambda != std::min((size_t)to, this->land.size());
       ++lambda) {
    for (size_t i = 1; i != this->land[lambda].size() - 1; ++i) {
      out << this->land[lambda][i].first << " " << this->land[lambda][i].second << std::endl;
    }
    out << "EOF" << std::endl;
  }
  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
}